

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-test.c++
# Opt level: O1

void __thiscall
capnp::_::anon_unknown_0::RpcDumper::addSchema(RpcDumper *this,InterfaceSchema schema)

{
  mapped_type *pmVar1;
  Schema local_50;
  key_type local_48;
  Reader local_40;
  
  local_50 = schema.super_Schema.raw;
  Schema::getProto(&local_40,&local_50);
  if (local_40._reader.dataSize < 0x40) {
    local_48 = 0;
  }
  else {
    local_48 = *local_40._reader.data;
  }
  pmVar1 = std::
           map<unsigned_long,_capnp::InterfaceSchema,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_capnp::InterfaceSchema>_>_>
           ::operator[](&this->schemas,&local_48);
  (pmVar1->super_Schema).raw = local_50.raw;
  return;
}

Assistant:

void addSchema(InterfaceSchema schema) {
    schemas[schema.getProto().getId()] = schema;
  }